

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimulationIdentifier.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::SimulationIdentifier::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,SimulationIdentifier *this)

{
  ostream *poVar1;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  SimulationIdentifier *local_18;
  SimulationIdentifier *this_local;
  
  local_18 = this;
  this_local = (SimulationIdentifier *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Site:        ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16SiteID);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Application: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16ApplicationID);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString SimulationIdentifier::GetAsString() const
{
    KStringStream ss;

    ss << "Site:        " << m_ui16SiteID           << "\n"
       << "Application: " << m_ui16ApplicationID    << "\n";

    return ss.str();
}